

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O2

int32 free_mllr_B(float32 ***B,uint32 n_class,uint32 n_stream)

{
  ulong uVar1;
  ulong uVar2;
  
  for (uVar1 = 0; uVar1 != n_class; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; n_stream != uVar2; uVar2 = uVar2 + 1) {
      ckd_free(B[uVar1][uVar2]);
    }
  }
  ckd_free_2d(B);
  return 0;
}

Assistant:

int32
free_mllr_B(float32 ***B,
	    uint32  n_class,
	    uint32  n_stream)
{
    uint32 i,j;

    for (i=0; i < n_class; i++) {
	for (j=0; j < n_stream; j++) {
	   ckd_free((void *)B[i][j]);
	}
    }
    ckd_free_2d((void **)B);

    return S3_SUCCESS;
}